

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityReferenceImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMEntityReferenceImpl::setReadOnly
          (DOMEntityReferenceImpl *this,bool readOnl,bool deep)

{
  int iVar1;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined8 *puVar2;
  undefined4 extraout_var_00;
  
  if (*(char *)((long)&(this->fParent).fOwnerDocument[0xb].super_DOMXPathEvaluator.
                       _vptr_DOMXPathEvaluator + 4) != '\x01' || readOnl) {
    DOMNodeImpl::setReadOnly(&this->fNode,readOnl,deep);
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  iVar1 = (*(this->super_DOMEntityReference).super_DOMNode._vptr_DOMNode[0xc])(this);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    puVar2 = &XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar1 = (*(this->super_DOMEntityReference).super_DOMNode._vptr_DOMNode[0xc])(this);
    puVar2 = (undefined8 *)(CONCAT44(extraout_var_00,iVar1) + 0x158);
  }
  DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar2);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMEntityReferenceImpl::setReadOnly(bool readOnl,bool deep)
{
    if(((DOMDocumentImpl *)fParent.fOwnerDocument)->getErrorChecking() && readOnl==false)
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    fNode.setReadOnly(readOnl,deep);
}